

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O0

BinaryPacketProtocol *
ssh_verstring_new(Conf *conf,LogContext *logctx,_Bool bare_connection_mode,char *protoversion,
                 ssh_version_receiver *rcv,_Bool server_mode,char *impl_name)

{
  _Bool _Var1;
  int iVar2;
  void *__s;
  Conf *pCVar3;
  char *pcVar4;
  strbuf *psVar5;
  ptrlen pVar6;
  byte local_91;
  void *local_70;
  size_t local_68;
  void *local_50;
  size_t local_48;
  ssh_verstring_state *s;
  _Bool server_mode_local;
  ssh_version_receiver *rcv_local;
  char *protoversion_local;
  _Bool bare_connection_mode_local;
  LogContext *logctx_local;
  Conf *conf_local;
  
  __s = safemalloc(1,400,0);
  memset(__s,0,400);
  if (bare_connection_mode) {
    pVar6 = make_ptrlen("SSHCONNECTION@putty.projects.tartarus.org-",0x2a);
    local_70 = pVar6.ptr;
    *(void **)((long)__s + 0x10) = local_70;
    local_68 = pVar6.len;
    *(size_t *)((long)__s + 0x18) = local_68;
  }
  else {
    pVar6 = make_ptrlen("SSH-",4);
    local_50 = pVar6.ptr;
    *(void **)((long)__s + 0x10) = local_50;
    local_48 = pVar6.len;
    *(size_t *)((long)__s + 0x18) = local_48;
  }
  if (0x40 < *(ulong *)((long)__s + 0x18)) {
    __assert_fail("s->prefix_wanted.len <= PREFIX_MAXLEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/verstring.c"
                  ,0x59,
                  "BinaryPacketProtocol *ssh_verstring_new(Conf *, LogContext *, _Bool, const char *, struct ssh_version_receiver *, _Bool, const char *)"
                 );
  }
  pCVar3 = conf_copy(conf);
  *(Conf **)((long)__s + 8) = pCVar3;
  *(LogContext **)((long)__s + 0x148) = logctx;
  pcVar4 = dupstr(protoversion);
  *(char **)((long)__s + 0x20) = pcVar4;
  *(ssh_version_receiver **)((long)__s + 0x28) = rcv;
  pcVar4 = dupstr(impl_name);
  *(char **)((long)__s + 0x80) = pcVar4;
  psVar5 = strbuf_new();
  *(strbuf **)((long)__s + 0x88) = psVar5;
  local_91 = 1;
  if (!server_mode) {
    _Var1 = ssh_version_includes_v1(protoversion);
    local_91 = _Var1 ^ 0xff;
  }
  *(byte *)((long)__s + 0x30) = local_91 & 1;
  iVar2 = conf_get_int(*(Conf **)((long)__s + 8),0xbe);
  if (iVar2 == 0) {
    *(undefined1 *)((long)__s + 0x30) = 0;
  }
  *(BinaryPacketProtocolVtable **)((long)__s + 0xb0) = &ssh_verstring_vtable;
  ssh_bpp_common_setup((BinaryPacketProtocol *)((long)__s + 0xb0));
  return (BinaryPacketProtocol *)((long)__s + 0xb0);
}

Assistant:

BinaryPacketProtocol *ssh_verstring_new(
    Conf *conf, LogContext *logctx, bool bare_connection_mode,
    const char *protoversion, struct ssh_version_receiver *rcv,
    bool server_mode, const char *impl_name)
{
    struct ssh_verstring_state *s = snew(struct ssh_verstring_state);

    memset(s, 0, sizeof(struct ssh_verstring_state));

    if (!bare_connection_mode) {
        s->prefix_wanted = PTRLEN_LITERAL("SSH-");
    } else {
        /*
         * Ordinary SSH begins with the banner "SSH-x.y-...". Here,
         * we're going to be speaking just the ssh-connection
         * subprotocol, extracted and given a trivial binary packet
         * protocol, so we need a new banner.
         *
         * The new banner is like the ordinary SSH banner, but
         * replaces the prefix 'SSH-' at the start with a new name. In
         * proper SSH style (though of course this part of the proper
         * SSH protocol _isn't_ subject to this kind of
         * DNS-domain-based extension), we define the new name in our
         * extension space.
         */
        s->prefix_wanted = PTRLEN_LITERAL(
            "SSHCONNECTION@putty.projects.tartarus.org-");
    }
    assert(s->prefix_wanted.len <= PREFIX_MAXLEN);

    s->conf = conf_copy(conf);
    s->bpp.logctx = logctx;
    s->our_protoversion = dupstr(protoversion);
    s->receiver = rcv;
    s->impl_name = dupstr(impl_name);
    s->vstring = strbuf_new();

    /*
     * We send our version string early if we can. But if it includes
     * SSH-1, we can't, because we have to take the other end into
     * account too (see below).
     *
     * In server mode, we do send early.
     */
    s->send_early = server_mode || !ssh_version_includes_v1(protoversion);

    /*
     * Override: we don't send our version string early if the server
     * has a bug that will make it discard it. See for example
     * https://bugs.debian.org/cgi-bin/bugreport.cgi?bug=991958
     */
    if (conf_get_int(s->conf, CONF_sshbug_dropstart) == FORCE_ON)
        s->send_early = false;

    s->bpp.vt = &ssh_verstring_vtable;
    ssh_bpp_common_setup(&s->bpp);
    return &s->bpp;
}